

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int error(int argc,char **argv)

{
  double *pdVar1;
  int iVar2;
  char *__s;
  undefined1 auVar3 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar4;
  pointer pbVar5;
  pointer pbVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  Allocator AVar12;
  allocator_type aVar13;
  pointer pdVar14;
  int64_t *piVar15;
  ulong uVar16;
  uint uVar17;
  value_type *mcve_1;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *pvVar18;
  Tuple2<pbrt::Point2,_int> resolution;
  long lVar19;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  int iVar20;
  long lVar21;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *__range2;
  pointer this;
  value_type *mcve;
  ulong uVar22;
  pointer pAVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  undefined8 in_XMM3_Qb;
  span<int> out;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  pixelVariance;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  array<int,_4UL> cropWindow;
  string metric;
  string filenameBase;
  string errorFile;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  pixelVariances;
  string referenceFile;
  vector<double,_std::allocator<double>_> sumErrors;
  vector<int,_std::allocator<int>_> spp;
  anon_class_8_1_e625a05e crop;
  ImageAndMetadata ref;
  Image errorImage;
  char **local_648;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  local_640;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_620;
  undefined1 local_608 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  vector<double,_std::allocator<double>_> local_560;
  undefined1 local_548 [16];
  code *local_538;
  code *local_530;
  _Any_data local_528;
  code *local_518;
  code *local_510;
  _Any_data local_508;
  code *local_4f8;
  code *local_4f0;
  double local_4e0;
  vector<int,_std::allocator<int>_> local_4d8;
  string *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  undefined1 local_498 [16];
  undefined1 auStack_488 [16];
  undefined1 local_478 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  polymorphic_allocator<unsigned_char> local_3c0;
  uchar *local_3b8;
  size_t local_3b0;
  size_t local_3a8;
  polymorphic_allocator<pbrt::Half> local_3a0;
  Half *local_398;
  size_t local_390;
  size_t local_388;
  polymorphic_allocator<float> local_380;
  float *local_378;
  size_t local_370;
  size_t local_368;
  bool local_35c;
  bool local_318;
  bool local_2d4;
  bool local_2c0;
  bool local_2b4;
  bool local_2ac;
  bool local_2a4;
  bool local_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_290;
  _Any_data local_260;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  long *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  long *local_188;
  undefined8 local_180;
  long local_178;
  undefined8 local_170;
  long *local_168;
  undefined8 local_160;
  long local_158;
  undefined8 local_150;
  ColorEncodingHandle local_148;
  ColorEncodingHandle local_140;
  undefined1 local_138 [72];
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_a8;
  undefined8 uStack_98;
  undefined8 local_90;
  optional<int> oStack_88;
  optional<float> oStack_80;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_78;
  undefined8 uStack_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_68;
  
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  local_580._M_string_length = 0;
  local_580.field_2._M_local_buf[0] = '\0';
  local_5f8._M_allocated_capacity = (size_type)&local_5e8;
  local_5b8._M_string_length = 0;
  local_5b8.field_2._M_local_buf[0] = '\0';
  local_648 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_608 + 0x10),"MSE","");
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  local_5d8._M_string_length = 0;
  local_5d8.field_2._M_local_buf[0] = '\0';
  local_608._0_8_ = (pointer)0xffffffff;
  local_608._8_8_ = 0xffffffff;
  if (*argv != (char *)0x0) {
    do {
      local_478._0_8_ = &local_468;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"reference","");
      local_4b8 = (_Any_data)0x0;
      local_4a0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                  ::_M_invoke;
      local_4a8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                  ::_M_manager;
      bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                        (&local_648,(string *)local_478,&local_580,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_4b8);
      bVar10 = true;
      if (!bVar9) {
        local_260._M_unused._M_object = &local_250;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"errorfile","");
        local_508 = (_Any_data)0x0;
        local_4f0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_invoke;
        local_4f8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_manager;
        bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                          (&local_648,(string *)&local_260,&local_5b8,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_508);
        bVar10 = true;
        if (!bVar9) {
          local_138._0_8_ = (long)local_138 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"metric","");
          local_528 = (_Any_data)0x0;
          local_510 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                      ::_M_invoke;
          local_518 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                      ::_M_manager;
          bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                            (&local_648,(string *)local_138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_608 + 0x10),
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_528);
          bVar10 = true;
          if (!bVar9) {
            local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int> =
                 (Tuple2<pbrt::Point2,_int>)&local_640.allocator;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"crop","");
            local_548 = (undefined1  [16])0x0;
            local_530 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                        ::_M_invoke;
            local_538 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                        ::_M_manager;
            out.n = (size_t)local_548;
            out.ptr = (int *)0x4;
            bVar10 = pbrt::ParseArg<pstd::span<int>>
                               ((pbrt *)&local_648,(char ***)&local_640,(string *)local_608,out,
                                in_R9);
            if (local_538 != (code *)0x0) {
              (*local_538)(local_548,local_548,3);
            }
            if (local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int> !=
                (Tuple2<pbrt::Point2,_int>)&local_640.allocator) {
              operator_delete((void *)local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>,
                              (ulong)((long)&(local_640.allocator.memoryResource)->
                                             _vptr_memory_resource + 1));
            }
          }
          if (local_518 != (code *)0x0) {
            (*local_518)(&local_528,&local_528,__destroy_functor);
          }
          if (local_138._0_8_ != (long)local_138 + 0x10) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
        }
        if (local_4f8 != (code *)0x0) {
          (*local_4f8)(&local_508,&local_508,__destroy_functor);
        }
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_260._M_unused._0_8_ != &local_250) {
          operator_delete(local_260._M_unused._M_object,
                          (ulong)((long)&(local_250.alloc.memoryResource)->_vptr_memory_resource + 1
                                 ));
        }
      }
      if (local_4a8 != (code *)0x0) {
        (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_478._0_8_ != &local_468) {
        operator_delete((void *)local_478._0_8_,(long)local_468.alloc.memoryResource + 1);
      }
      if (bVar10 == false) {
        __s = *local_648;
        if ((local_5d8._M_string_length != 0) || (*__s == '-')) {
          usage("error","%s: unknown argument",__s);
        }
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_5d8,0,(char *)0x0,(ulong)__s);
        local_648 = local_648 + 1;
      }
    } while (*local_648 != (char *)0x0);
    if (local_5d8._M_string_length != 0) {
      iVar11 = std::__cxx11::string::compare(local_608 + 0x10);
      if (iVar11 != 0) {
        iVar11 = std::__cxx11::string::compare(local_608 + 0x10);
        if (iVar11 != 0) {
          iVar11 = std::__cxx11::string::compare(local_608 + 0x10);
          if (iVar11 != 0) {
            usage("error","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
                  local_5f8._M_allocated_capacity);
          }
        }
      }
      pbrt::MatchingFilenames(&local_620,&local_5d8);
      if (local_620.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_620.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        error();
        uVar17 = 1;
      }
      else {
        if (local_580._M_string_length == 0) {
          usage("error","must provide --reference file.");
        }
        AVar12.memoryResource = pstd::pmr::new_delete_resource();
        local_140.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        pbrt::Image::Read((ImageAndMetadata *)local_478,&local_580,AVar12,&local_140);
        if ((long)local_608._0_8_ < 0) {
          local_608._4_4_ = local_608._0_4_ - local_608._4_4_;
        }
        if ((long)local_608._8_8_ < 0) {
          local_608._12_4_ = local_608._8_4_ - local_608._12_4_;
        }
        local_4c0 = (string *)local_608;
        error::anon_class_8_1_e625a05e::operator()
                  ((anon_class_8_1_e625a05e *)local_4c0,(Image *)local_478);
        iVar11 = pbrt::MaxThreadIndex();
        std::
        vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
        ::vector(&local_598,(long)iVar11,(allocator_type *)local_260._M_pod_data);
        pAVar23 = local_598.
                  super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_598.
            super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_598.
            super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this = local_598.
                 super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_478._0_8_;
          do {
            uVar8 = local_478._8_4_;
            local_478._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
            uVar7 = local_478._4_4_;
            uVar22 = (ulong)(uint)local_478._8_4_;
            local_478._0_8_ = pIVar4;
            aVar13.memoryResource = pstd::pmr::new_delete_resource();
            local_138._0_4_ = (int)uVar7 >> 0x1f & uVar7;
            local_138._4_4_ = (int)uVar8 >> 0x1f & uVar8;
            uVar16 = 0;
            if (0 < (int)uVar7) {
              uVar16 = (ulong)(uint)uVar7;
            }
            if ((int)uVar8 < 1) {
              uVar22 = 0;
            }
            local_138._8_8_ = uVar16 | uVar22 << 0x20;
            pbrt::
            Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            ::Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                       *)&local_260,(Bounds2i *)local_138,aVar13);
            pbrt::
            Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            ::operator=(this,(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                              *)&local_260);
            pbrt::
            Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            ::~Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                        *)&local_260);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
            auVar27 = vpsubd_avx(auVar25,auVar27);
            auVar25 = vpshufd_avx(auVar27,0x55);
            auVar25 = vpmulld_avx(auVar25,auVar27);
            if (auVar25._0_4_ != 0) {
              pvVar18 = this->values;
              lVar21 = (long)auVar25._0_4_ * 0x18;
              do {
                std::
                vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                ::resize(pvVar18,(long)(int)(uint)local_468.nStored);
                pvVar18 = pvVar18 + 1;
                lVar21 = lVar21 + -0x18;
              } while (lVar21 != 0);
            }
            this = this + 1;
            pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_478._0_8_;
          } while (this != pAVar23);
        }
        iVar11 = pbrt::MaxThreadIndex();
        local_260._M_unused._M_object = (void *)0x0;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_560,(long)iVar11,(value_type_conflict4 *)&local_260,
                   (allocator_type *)local_138);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_4d8,
                   (long)local_620.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_620.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5,
                   (allocator_type *)local_260._M_pod_data);
        pbVar6 = local_620.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = local_620.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_498._0_8_ = (memory_resource *)0x0;
        local_498._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        auStack_488._0_8_ = (pointer)0x0;
        auStack_488._8_8_ = 0;
        local_498._0_8_ = operator_new(0x38);
        local_260._M_unused._M_object = local_498;
        ((memory_resource *)local_498._0_8_)->_vptr_memory_resource = (_func_int **)&local_620;
        ((memory_resource *)(local_498._0_8_ + 8))->_vptr_memory_resource = (_func_int **)&local_4c0
        ;
        ((memory_resource *)(local_498._0_8_ + 0x10))->_vptr_memory_resource =
             (_func_int **)&local_4d8;
        ((memory_resource *)(local_498._0_8_ + 0x18))->_vptr_memory_resource =
             (_func_int **)local_478;
        ((memory_resource *)(local_498._0_8_ + 0x20))->_vptr_memory_resource =
             (_func_int **)(local_608 + 0x10);
        ((memory_resource *)(local_498._0_8_ + 0x28))->_vptr_memory_resource =
             (_func_int **)&local_560;
        ((memory_resource *)(local_498._0_8_ + 0x30))->_vptr_memory_resource =
             (_func_int **)&local_598;
        auStack_488._8_8_ =
             std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:721:38)>
             ::_M_invoke;
        auStack_488._0_8_ =
             std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:721:38)>
             ::_M_manager;
        local_260._8_8_ = 0;
        local_250.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
        local_250.alloc.memoryResource =
             (memory_resource *)
             std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
        pbrt::ParallelFor(0,(long)pbVar6 - (long)pbVar5 >> 5,
                          (function<void_(long,_long)> *)&local_260);
        if (local_250.alloc.memoryResource != (memory_resource *)0x0) {
          (*(code *)local_250.alloc.memoryResource)(&local_260,&local_260,3);
        }
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_478._0_8_;
        if ((pointer)auStack_488._0_8_ != (pointer)0x0) {
          (*(code *)auStack_488._0_8_)(local_498,local_498,3);
          pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_478._0_8_;
        }
        uVar8 = local_478._8_4_;
        local_478._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
        uVar7 = local_478._4_4_;
        uVar16 = (long)local_620.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_620.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        local_478._0_8_ = pIVar4;
        if (1 < uVar16) {
          lVar21 = uVar16 - 1;
          lVar19 = 4;
          do {
            if (*(uint *)((long)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar19) !=
                *local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
              printf("%s: spp %d mismatch. %s has %d.\n",
                     (&(local_620.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar19]._M_p,
                     (ulong)*(uint *)((long)local_4d8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar19),
                     ((local_620.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
              uVar17 = 1;
              goto LAB_00237a6c;
            }
            lVar19 = lVar19 + 4;
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
        }
        local_4e0 = 0.0;
        for (pdVar14 = local_560.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar14 !=
            local_560.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
          local_4e0 = local_4e0 + *pdVar14;
        }
        aVar13.memoryResource = pstd::pmr::new_delete_resource();
        local_260._M_unused._M_member_pointer =
             CONCAT44((int)uVar8 >> 0x1f & uVar8,(int)uVar7 >> 0x1f & uVar7);
        uVar22 = 0;
        uVar16 = 0;
        if (0 < (int)uVar7) {
          uVar16 = (ulong)(uint)uVar7;
        }
        if (0 < (int)uVar8) {
          uVar22 = (ulong)(uint)uVar8;
        }
        local_260._8_8_ = uVar16 | uVar22 << 0x20;
        pbrt::
        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
        ::Array2D(&local_640,(Bounds2i *)&local_260,aVar13);
        auVar26._4_4_ = local_640.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
        auVar26._0_4_ = local_640.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
        auVar26._8_8_ = 0;
        auVar28._8_8_ = 0;
        auVar28._0_4_ = local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
        auVar28._4_4_ = local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
        auVar27 = vpsubd_avx(auVar26,auVar28);
        auVar25 = vpshufd_avx(auVar27,0x55);
        auVar25 = vpmulld_avx(auVar25,auVar27);
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_478._0_8_;
        if (auVar25._0_4_ != 0) {
          lVar21 = (long)auVar25._0_4_ * 0x18;
          pvVar18 = local_640.values;
          do {
            std::
            vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
            ::resize(pvVar18,(long)(int)(uint)local_468.nStored);
            pvVar18 = pvVar18 + 1;
            lVar21 = lVar21 + -0x18;
            pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_478._0_8_;
          } while (lVar21 != 0);
        }
        local_478._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
        resolution.y = local_478._8_4_;
        resolution.x = local_478._4_4_;
        for (pAVar23 = local_598.
                       super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pAVar23 !=
            local_598.
            super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pAVar23 = pAVar23 + 1) {
          if (0 < resolution.y) {
            iVar11 = 0;
            do {
              if (0 < resolution.x) {
                iVar20 = 0;
                uVar17 = (uint)local_468.nStored;
                do {
                  if (0 < (int)uVar17) {
                    lVar21 = 0;
                    lVar19 = 0;
                    local_478._0_8_ = pIVar4;
                    do {
                      iVar2 = (pAVar23->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
                      pbrt::VarianceEstimator<double>::Merge
                                ((VarianceEstimator<double> *)
                                 ((long)&(local_640.values
                                          [(local_640.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x
                                           - local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x
                                           ) * (iVar11 - local_640.extent.pMin.
                                                         super_Tuple2<pbrt::Point2,_int>.y) +
                                           (iVar20 - local_640.extent.pMin.
                                                     super_Tuple2<pbrt::Point2,_int>.x)].
                                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->mean + lVar21)
                                 ,(VarianceEstimator<double> *)
                                  ((long)&(pAVar23->values
                                           [((pAVar23->extent).pMax.super_Tuple2<pbrt::Point2,_int>.
                                             x - iVar2) *
                                            (iVar11 - (pAVar23->extent).pMin.
                                                      super_Tuple2<pbrt::Point2,_int>.y) +
                                            (iVar20 - iVar2)].
                                           super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->mean + lVar21
                                  ));
                      lVar19 = lVar19 + 1;
                      lVar21 = lVar21 + 0x18;
                    } while (lVar19 < (int)(uint)local_468.nStored);
                    resolution.y = local_478._8_4_;
                    resolution.x = local_478._4_4_;
                    uVar17 = (uint)local_468.nStored;
                    pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_478._0_8_;
                  }
                  iVar20 = iVar20 + 1;
                } while (iVar20 < resolution.x);
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < resolution.y);
          }
        }
        local_138._0_8_ = (long)local_138 + 0x10;
        local_478._0_8_ = pIVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,local_5f8._M_allocated_capacity,
                   local_5f8._8_8_ + local_5f8._M_allocated_capacity);
        local_148.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        AVar12.memoryResource = pstd::pmr::new_delete_resource();
        channels.n = 1;
        channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138;
        pbrt::Image::Image((Image *)&local_260,Float,(Point2i)resolution,channels,&local_148,AVar12)
        ;
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_478._0_8_;
        if (local_138._0_8_ != (long)local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_478._0_8_;
        }
        local_478._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
        lVar21 = CONCAT44(local_478._8_4_,local_478._4_4_);
        if (0 < (int)local_478._8_4_) {
          lVar19 = 0;
          do {
            if (0 < (int)lVar21) {
              uVar16 = 0;
              local_478._0_8_ = pIVar4;
              do {
                if ((int)(uint)local_468.nStored < 1) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = 0.0;
                  uVar22 = (ulong)((uint)local_468.nStored & 0x7fffffff);
                  piVar15 = &(local_640.values
                              [(local_640.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                               local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                               ((int)lVar19 -
                               local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                               ((int)uVar16 -
                               local_640.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)].
                              super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->n;
                  do {
                    lVar21 = *piVar15;
                    pdVar1 = (double *)(piVar15 + -1);
                    piVar15 = piVar15 + 3;
                    uVar22 = uVar22 - 1;
                    fVar24 = (float)((double)((ulong)(1 < lVar21) *
                                             (long)(*pdVar1 / (double)(lVar21 + -1))) +
                                    (double)fVar24);
                  } while (uVar22 != 0);
                }
                pbrt::Image::SetChannel
                          ((Image *)&local_260,(Point2i)(lVar19 << 0x20 | uVar16),0,
                           fVar24 / (float)(int)(uint)local_468.nStored);
                lVar21 = CONCAT44(local_478._8_4_,local_478._4_4_);
                uVar16 = uVar16 + 1;
                pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_478._0_8_;
              } while ((long)uVar16 < (long)(int)local_478._4_4_);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < lVar21 >> 0x20);
        }
        auVar3._4_4_ = in_XMM3_Db;
        auVar3._0_4_ = in_XMM3_Da;
        auVar3._8_8_ = in_XMM3_Qb;
        vcvtusi2sd_avx512f(auVar3,((long)local_620.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_620.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
        local_478._0_8_ = pIVar4;
        printf("%s estimate = %.9g\n",local_5f8._M_allocated_capacity);
        if (local_5b8._M_string_length == 0) {
          uVar17 = 0;
        }
        else {
          _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
               &_Stack_68._M_impl.super__Rb_tree_header._M_header;
          aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                       )0x0;
          uStack_70._0_1_ = false;
          uStack_70._1_7_ = 0;
          _Stack_68._M_impl._0_8_ = 0;
          _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          _Stack_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          uStack_b8 = 0;
          uStack_b0 = 0;
          aStack_a8._0_8_ = 0;
          aStack_a8._8_8_ = 0;
          uStack_98 = 0;
          local_90 = 0;
          oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          oStack_88.set = false;
          oStack_88._5_3_ = 0;
          oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          oStack_80.set = false;
          oStack_80._5_3_ = 0;
          local_138._64_8_ = 0;
          uStack_f0 = 0;
          uStack_e8 = 0;
          uStack_e0 = 0;
          uStack_d8 = 0;
          uStack_d0 = 0;
          uStack_c8 = 0;
          uStack_c0 = 0;
          local_138._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_138[4] = false;
          local_138._5_3_ = 0;
          local_138._8_4_ = 0;
          local_138._12_4_ = 0;
          local_138._16_8_ = 0;
          local_138._24_8_ = 0;
          local_138._32_8_ = 0;
          local_138._40_8_ = 0;
          local_138._48_8_ = 0;
          local_138._56_8_ = 0;
          _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
          _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
               _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar9 = pbrt::Image::Write((Image *)&local_260,&local_5b8,(ImageMetadata *)local_138);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&_Stack_68);
          uVar17 = (uint)!bVar9;
        }
        local_150 = 0;
        (**(code **)(*local_168 + 0x18))(local_168,local_160,local_158 << 2,4);
        local_170 = 0;
        (**(code **)(*local_188 + 0x18))(local_188,local_180,local_178 * 2,2);
        local_190 = 0;
        (**(code **)(*local_1a8 + 0x18))(local_1a8,local_1a0,local_198,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&local_250);
        pbrt::
        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
        ::~Array2D(&local_640);
LAB_00237a6c:
        if ((uint *)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_560.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_560.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_560.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_560.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
        ::~vector(&local_598);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_290);
        if (local_298 == true) {
          local_298 = false;
        }
        if (local_2a4 == true) {
          local_2a4 = false;
        }
        if (local_2ac == true) {
          local_2ac = false;
        }
        if (local_2b4 == true) {
          local_2b4 = false;
        }
        if (local_2c0 == true) {
          local_2c0 = false;
        }
        if (local_2d4 == true) {
          local_2d4 = false;
        }
        if (local_318 == true) {
          local_318 = false;
        }
        if (local_35c == true) {
          local_35c = false;
        }
        local_368 = 0;
        (*(local_380.memoryResource)->_vptr_memory_resource[3])
                  (local_380.memoryResource,local_378,local_370 << 2,4);
        local_388 = 0;
        (*(local_3a0.memoryResource)->_vptr_memory_resource[3])
                  (local_3a0.memoryResource,local_398,local_390 * 2,2);
        local_3a8 = 0;
        (*(local_3c0.memoryResource)->_vptr_memory_resource[3])
                  (local_3c0.memoryResource,local_3b8,local_3b0,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&local_468);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_620);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,
                        CONCAT71(local_5d8.field_2._M_allocated_capacity._1_7_,
                                 local_5d8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_allocated_capacity != &local_5e8) {
        operator_delete((void *)local_5f8._M_allocated_capacity,local_5e8._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,
                        CONCAT71(local_5b8.field_2._M_allocated_capacity._1_7_,
                                 local_5b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_dataplus._M_p != &local_580.field_2) {
        operator_delete(local_580._M_dataplus._M_p,
                        CONCAT71(local_580.field_2._M_allocated_capacity._1_7_,
                                 local_580.field_2._M_local_buf[0]) + 1);
      }
      return uVar17;
    }
  }
  usage("error","Must provide base filename.");
}

Assistant:

int error(int argc, char *argv[]) {
    std::string referenceFile, errorFile, metric = "MSE";
    std::string filenameBase;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("error", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "errorfile", &errorFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("error", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("error", "Must provide base filename.");
    if (metric != "MSE" && metric != "MRSE" && metric != "L1")
        usage("error", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    if (referenceFile.empty())
        usage("error", "must provide --reference file.");
    ImageAndMetadata ref = Image::Read(referenceFile);
    Image &referenceImage = ref.image;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    auto crop = [&cropWindow](Image &image) {
        if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
            image = image.Crop(
                Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
    };

    crop(referenceImage);

    // Compute error and error image
    using MultiChannelVarianceEstimator = std::vector<VarianceEstimator<double>>;
    std::vector<Array2D<MultiChannelVarianceEstimator>> pixelVariances(MaxThreadIndex());
    for (auto &amcve : pixelVariances) {
        amcve = Array2D<MultiChannelVarianceEstimator>(referenceImage.Resolution().x,
                                                       referenceImage.Resolution().y);
        for (auto &mcve : amcve)
            mcve.resize(referenceImage.NChannels());
    }

    std::vector<double> sumErrors(MaxThreadIndex(), 0.);
    std::vector<int> spp(filenames.size());
    std::atomic<bool> failed{false};
    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;
        crop(im);

        CHECK(imRead.metadata.samplesPerPixel.has_value());
        spp[i] = *imRead.metadata.samplesPerPixel;

        Image diffImage;
        ImageChannelValues error(referenceImage.NChannels());
        if (metric == "L1")
            error = im.L1Error(im.AllChannelsDesc(), referenceImage, &diffImage);
        else if (metric == "MSE")
            error = im.MSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        else
            error = im.MRSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        sumErrors[ThreadIndex] += error.Average();

        for (int y = 0; y < im.Resolution().y; ++y)
            for (int x = 0; x < im.Resolution().x; ++x) {
                MultiChannelVarianceEstimator &pixelVariance =
                    pixelVariances[ThreadIndex](x, y);
                for (int c = 0; c < im.NChannels(); ++c)
                    if (metric == "MRSE")
                        pixelVariance[c].Add(
                            im.GetChannel({x, y}, c) /
                            (0.01f + referenceImage.GetChannel({x, y}, c)));
                    else
                        pixelVariance[c].Add(im.GetChannel({x, y}, c));
            }
    });

    for (int i = 1; i < filenames.size(); ++i) {
        if (spp[i] != spp[0]) {
            printf("%s: spp %d mismatch. %s has %d.\n", filenames[i].c_str(), spp[i],
                   filenames[0].c_str(), spp[0]);
            return 1;
        }
    }

    if (failed)
        return 1;

    double sumError = std::accumulate(sumErrors.begin(), sumErrors.end(), 0.);

    Array2D<MultiChannelVarianceEstimator> pixelVariance(referenceImage.Resolution().x,
                                                         referenceImage.Resolution().y);
    for (auto &mcve : pixelVariance)
        mcve.resize(referenceImage.NChannels());

    for (const auto &pixVar : pixelVariances)
        for (int y = 0; y < referenceImage.Resolution().y; ++y)
            for (int x = 0; x < referenceImage.Resolution().x; ++x)
                for (int c = 0; c < referenceImage.NChannels(); ++c)
                    pixelVariance(x, y)[c].Merge(pixVar(x, y)[c]);

    Image errorImage(PixelFormat::Float,
                     {referenceImage.Resolution().x, referenceImage.Resolution().y},
                     {metric});
    for (int y = 0; y < referenceImage.Resolution().y; ++y)
        for (int x = 0; x < referenceImage.Resolution().x; ++x) {
            Float varSum = 0;
            for (int c = 0; c < referenceImage.NChannels(); ++c)
                varSum += pixelVariance(x, y)[c].Variance();
            errorImage.SetChannel({x, y}, 0, varSum / referenceImage.NChannels());
        }

    // MSE is the average over all of the pixels
    double error = sumError / (filenames.size() - 1);
    printf("%s estimate = %.9g\n", metric.c_str(), error);

    if (!errorFile.empty() && !errorImage.Write(errorFile)) {
        return 1;
    }

    return 0;
}